

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O1

void test_ADynArray_construct_destruct_withAllocator_valid_fn(int _i)

{
  void *dynArray;
  size_t *psVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  size_t local_28;
  char *local_20;
  size_t local_18 [2];
  
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  private_ACUtilsTest_ADynArray_freeCount = 0;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  local_18[1] = 0x10a2a6;
  dynArray = private_ACUtils_ADynArray_constructWithAllocator
                       (1,private_ACUtilsTest_ADynArray_realloc,private_ACUtilsTest_ADynArray_free);
  if (*(size_t *)((long)dynArray + 0x18) == 0) {
    local_18[1] = 0x10a2c7;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x41);
    sVar7 = *(size_t *)((long)dynArray + 0x20);
    if (sVar7 != 8) {
      pcVar4 = "array->capacity == private_ACUtilsTest_ADynArray_capacityMin";
      pcVar6 = "array->capacity";
      iVar2 = 0x42;
      local_18[0] = 8;
      local_20 = "private_ACUtilsTest_ADynArray_capacityMin";
LAB_0010a479:
      local_18[1] = 0;
      local_28 = sVar7;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                        ,iVar2,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar4,pcVar6);
    }
    local_18[1] = 0x10a2e6;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x42);
    if (*(long *)((long)dynArray + 0x28) == 0) {
      psVar1 = local_18;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar3 = "(void*) array->buffer != NULL";
      pcVar5 = "(void*) array->buffer";
      iVar2 = 0x43;
    }
    else {
      local_18[1] = 0x10a302;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x43);
      if (*(long *)((long)dynArray + 0x10) != 0) {
        local_18[1] = 0x10a31e;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x44);
        local_18[1] = 0x10a326;
        private_ACUtils_ADynArray_destruct(dynArray);
        if (private_ACUtilsTest_ADynArray_reallocCount == private_ACUtilsTest_ADynArray_freeCount) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x46);
          return;
        }
        pcVar4 = 
        "private_ACUtilsTest_ADynArray_reallocCount == private_ACUtilsTest_ADynArray_freeCount";
        pcVar6 = "private_ACUtilsTest_ADynArray_reallocCount";
        iVar2 = 0x46;
        local_18[0] = private_ACUtilsTest_ADynArray_freeCount;
        local_20 = "private_ACUtilsTest_ADynArray_freeCount";
        sVar7 = private_ACUtilsTest_ADynArray_reallocCount;
        goto LAB_0010a479;
      }
      psVar1 = local_18;
      pcVar6 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar3 = "(void*) array->growStrategy != NULL";
      pcVar5 = "(void*) array->growStrategy";
      iVar2 = 0x44;
    }
  }
  else {
    psVar1 = &local_28;
    local_20 = "0";
    pcVar6 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar3 = "array->size == 0";
    pcVar5 = "array->size";
    iVar2 = 0x41;
    local_28 = *(size_t *)((long)dynArray + 0x18);
  }
  local_18[1] = 0;
  local_18[0] = 0;
  *(undefined8 *)((long)psVar1 + -8) = 0x10a443;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar2,pcVar6,pcVar4,pcVar3,pcVar5);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_construct_destruct_withAllocator_valid)
{
    struct private_ACUtilsTest_ADynArray_CharArray *array;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    private_ACUtilsTest_ADynArray_reallocCount = private_ACUtilsTest_ADynArray_freeCount = 0;
    array = ADynArray_constructWithAllocator(struct private_ACUtilsTest_ADynArray_CharArray, private_ACUtilsTest_ADynArray_realloc, private_ACUtilsTest_ADynArray_free);
    ACUTILSTEST_ASSERT_UINT_EQ(array->size, 0);
    ACUTILSTEST_ASSERT_UINT_EQ(array->capacity, private_ACUtilsTest_ADynArray_capacityMin);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array->buffer);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array->growStrategy);
    ADynArray_destruct(array);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, private_ACUtilsTest_ADynArray_freeCount);
}